

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressEnd_public
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_compressionStage_e ZVar1;
  ulong len;
  XXH64_hash_t XVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long_long uVar6;
  size_t err_code_1;
  size_t sVar7;
  size_t sVar8;
  xxh_u64 xVar9;
  size_t err_code;
  long lVar10;
  ulong uVar11;
  size_t err_code_2;
  undefined4 *puVar12;
  undefined4 *dst_00;
  
  sVar7 = ZSTD_compressContinue_internal(cctx,dst,dstCapacity,src,srcSize,1,1);
  if (0xffffffffffffff88 < sVar7) {
    return sVar7;
  }
  ZVar1 = cctx->stage;
  if (ZVar1 == ZSTDcs_created) {
    return 0xffffffffffffffc4;
  }
  dst_00 = (undefined4 *)((long)dst + sVar7);
  uVar11 = dstCapacity - sVar7;
  puVar12 = dst_00;
  if (ZVar1 != ZSTDcs_ending) {
    if (ZVar1 == ZSTDcs_init) {
      src = (void *)0x0;
      sVar8 = ZSTD_writeFrameHeader(dst_00,uVar11,&cctx->appliedParams,0,0);
      if (0xffffffffffffff88 < sVar8) {
        return sVar8;
      }
      uVar11 = uVar11 - sVar8;
      cctx->stage = ZSTDcs_ongoing;
      puVar12 = (undefined4 *)(sVar8 + (long)dst_00);
    }
    if (uVar11 < 4) {
      return 0xffffffffffffffba;
    }
    *puVar12 = 1;
    uVar11 = uVar11 - 3;
    puVar12 = (undefined4 *)((long)puVar12 + 3);
  }
  if ((cctx->appliedParams).fParams.checksumFlag != 0) {
    len = (cctx->xxhState).total_len;
    if (len < 0x20) {
      lVar10 = (cctx->xxhState).v[2] + 0x27d4eb2f165667c5;
    }
    else {
      XVar2 = (cctx->xxhState).v[0];
      uVar3 = (cctx->xxhState).v[1];
      uVar4 = (cctx->xxhState).v[2];
      uVar5 = (cctx->xxhState).v[3];
      src = (void *)(((uVar3 * -0x6c158a5880000000 | uVar3 * -0x3d4d51c2d82b14b1 >> 0x21) *
                      -0x61c8864e7a143579 ^
                     ((XVar2 * -0x6c158a5880000000 | XVar2 * -0x3d4d51c2d82b14b1 >> 0x21) *
                      -0x61c8864e7a143579 ^
                     (uVar5 << 0x12 | uVar5 >> 0x2e) + (uVar4 << 0xc | uVar4 >> 0x34) +
                     (uVar3 << 7 | uVar3 >> 0x39) + (XVar2 << 1 | (ulong)((long)XVar2 < 0))) *
                     -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 +
                    -0x7a1435883d4d519d);
      lVar10 = ((uVar5 * -0x6c158a5880000000 | uVar5 * -0x3d4d51c2d82b14b1 >> 0x21) *
                -0x61c8864e7a143579 ^
               ((uVar4 * -0x6c158a5880000000 | uVar4 * -0x3d4d51c2d82b14b1 >> 0x21) *
                -0x61c8864e7a143579 ^ (ulong)src) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) *
               -0x61c8864e7a143579 + -0x7a1435883d4d519d;
    }
    xVar9 = XXH64_finalize(lVar10 + len,(xxh_u8 *)(cctx->xxhState).mem64,len,(XXH_alignment)src);
    if (uVar11 < 4) {
      return 0xffffffffffffffba;
    }
    *puVar12 = (int)xVar9;
    puVar12 = puVar12 + 1;
  }
  cctx->stage = ZSTDcs_created;
  uVar11 = (long)puVar12 - (long)dst_00;
  if (0xffffffffffffff88 < uVar11) {
    return uVar11;
  }
  uVar6 = cctx->pledgedSrcSizePlusOne;
  if ((cctx->appliedParams).fParams.contentSizeFlag == 0) {
    if (uVar6 == 0) goto LAB_00182ca2;
  }
  else if (uVar6 == 0) {
    __assert_fail("!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x64f5,
                  "size_t ZSTD_compressEnd_public(ZSTD_CCtx *, void *, size_t, const void *, size_t)"
                 );
  }
  if (uVar6 != cctx->consumedSrcSize + 1) {
    return 0xffffffffffffffb8;
  }
LAB_00182ca2:
  return uVar11 + sVar7;
}

Assistant:

size_t ZSTD_compressEnd_public(ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize)
{
    size_t endResult;
    size_t const cSize = ZSTD_compressContinue_internal(cctx,
                                dst, dstCapacity, src, srcSize,
                                1 /* frame mode */, 1 /* last chunk */);
    FORWARD_IF_ERROR(cSize, "ZSTD_compressContinue_internal failed");
    endResult = ZSTD_writeEpilogue(cctx, (char*)dst + cSize, dstCapacity-cSize);
    FORWARD_IF_ERROR(endResult, "ZSTD_writeEpilogue failed");
    assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
    if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
        ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
        DEBUGLOG(4, "end of frame : controlling src size");
        RETURN_ERROR_IF(
            cctx->pledgedSrcSizePlusOne != cctx->consumedSrcSize+1,
            srcSize_wrong,
             "error : pledgedSrcSize = %u, while realSrcSize = %u",
            (unsigned)cctx->pledgedSrcSizePlusOne-1,
            (unsigned)cctx->consumedSrcSize);
    }
    ZSTD_CCtx_trace(cctx, endResult);
    return cSize + endResult;
}